

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

type_conflict1
dukglue_pcall_method<int,DukValue,int>(duk_context *ctx,DukValue *obj,char *method_name,int args)

{
  duk_int_t return_code;
  DukErrorException *this;
  DukValue *pDStack_48;
  duk_idx_t rc;
  SafeMethodCallData<int,_DukValue,_int> data;
  int out;
  int args_local;
  char *method_name_local;
  DukValue *obj_local;
  duk_context *ctx_local;
  
  pDStack_48 = obj;
  data.obj = (DukValue *)method_name;
  data.out._4_4_ = args;
  std::tuple<int>::tuple<int_&,_true,_true>
            ((tuple<int> *)&data.method_name,(int *)((long)&data.out + 4));
  data._16_8_ = &data.out;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<int,DukValue,int>,
                              &stack0xffffffffffffffb8,0,1);
  if (return_code != 0) {
    this = (DukErrorException *)__cxa_allocate_exception(0x28);
    DukErrorException::DukErrorException(this,ctx,return_code,true);
    __cxa_throw(this,&DukErrorException::typeinfo,DukErrorException::~DukErrorException);
  }
  duk_pop(ctx);
  return (type_conflict1)data.out;
}

Assistant:

typename std::enable_if<!std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	RetT out;
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), &out
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
	return std::move(out);
}